

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
serialize<google::sparsehash_internal::pod_serializer<std::pair<std::pair<int,int>const,int>>,StringIO>
          (dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,StringIO *param_2)

{
  int iVar1;
  bool bVar2;
  ulong in_RAX;
  long lVar3;
  int iVar4;
  int bit;
  long lVar5;
  int *piVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uchar bits;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar2 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>(param_2,0x13578642,4);
  if (((bVar2) &&
      (bVar2 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x60),8), bVar2)) &&
     (bVar2 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x58),8), bVar2)) {
    uVar8 = *(ulong *)(this + 0x60);
    if (uVar8 == 0) {
      return true;
    }
    lVar10 = 0;
    uVar9 = 0;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      iVar4 = *(int *)(this + 0x38);
      piVar6 = (int *)(*(long *)(this + 0x78) + lVar10);
      lVar3 = 0;
      bVar7 = 0;
      do {
        if (lVar3 + uVar9 < uVar8) {
          iVar4 = iVar4 + 1;
          iVar1 = *piVar6;
          *(int *)(this + 0x38) = iVar4;
          if (*(int *)(this + 0x44) != iVar1) {
            bVar7 = bVar7 | (byte)(1 << ((byte)lVar3 & 0x1f));
            uStack_38 = CONCAT17(bVar7,(undefined7)uStack_38);
          }
        }
        lVar3 = lVar3 + 1;
        piVar6 = piVar6 + 3;
      } while (lVar3 != 8);
      std::__cxx11::string::append((char *)param_2->s_,(long)&uStack_38 + 7);
      lVar5 = 0;
      lVar3 = lVar10;
      do {
        if ((uStack_38._7_1_ >> ((uint)lVar5 & 0x1f) & 1) != 0) {
          std::__cxx11::string::append((char *)param_2->s_,*(long *)(this + 0x78) + lVar3);
        }
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 0xc;
      } while (lVar5 != 8);
      uVar9 = uVar9 + 8;
      uVar8 = *(ulong *)(this + 0x60);
      lVar10 = lVar10 + 0x60;
    } while (uVar9 < uVar8);
    return true;
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }